

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

address __thiscall
pstore::index::details::internal_node::flush
          (internal_node *this,transaction_base *transaction,uint shifts)

{
  bool bVar1;
  address aVar2;
  address *a;
  address local_68;
  linear_node *local_60;
  linear_node *linear;
  internal_node *local_50;
  internal_node *internal;
  index_pointer *p;
  iterator __end2;
  iterator __begin2;
  internal_node *__range2;
  transaction_base *ptStack_20;
  uint shifts_local;
  transaction_base *transaction_local;
  internal_node *this_local;
  
  __range2._4_4_ = shifts + 6;
  __begin2 = (iterator)this;
  ptStack_20 = transaction;
  transaction_local = (transaction_base *)this;
  __end2 = begin(this);
  p = end((internal_node *)&__begin2->addr_);
  do {
    if (__end2 == p) {
      aVar2 = store_node(this,ptStack_20);
      aVar2 = operator|(aVar2,1);
      return (address)aVar2.a_;
    }
    internal = (internal_node *)&__end2->addr_;
    bVar1 = index_pointer::is_heap((index_pointer *)&__end2->addr_);
    if (bVar1) {
      if (__range2._4_4_ < 0x42) {
        bVar1 = index_pointer::is_internal((index_pointer *)internal);
        if (!bVar1) {
          assert_failed("p.is_internal ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                        ,0x162);
        }
        local_50 = index_pointer::untag<pstore::index::details::internal_node*,void>
                             ((index_pointer *)internal);
        linear = (linear_node *)flush(local_50,ptStack_20,__range2._4_4_);
        index_pointer::operator=((index_pointer *)internal,(address *)&linear);
      }
      else {
        bVar1 = index_pointer::is_linear((index_pointer *)internal);
        if (!bVar1) {
          assert_failed("p.is_linear ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                        ,0x169);
        }
        local_60 = index_pointer::untag<pstore::index::details::linear_node*,void>
                             ((index_pointer *)internal);
        aVar2 = linear_node::flush(local_60,ptStack_20);
        local_68 = operator|(aVar2,1);
        a = &local_68;
        index_pointer::operator=((index_pointer *)internal,a);
        if (local_60 != (linear_node *)0x0) {
          linear_node::operator_delete(local_60,a);
        }
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

address internal_node::flush (transaction_base & transaction, unsigned shifts) {
                shifts += hash_index_bits;
                for (auto & p : *this) {
                    // If it is a heap node, flush its children first (depth-first search).
                    if (p.is_heap ()) {
                        if (shifts < max_hash_bits) { // internal node
                            PSTORE_ASSERT (p.is_internal ());
                            auto * const internal = p.untag<internal_node *> ();
                            p = internal->flush (transaction, shifts);
                            // This node is owned by a container in the outer HAMT structure. Don't
                            // delete it here. If this ever changes, then add a 'delete internal;'
                            // here.
                        } else { // linear node
                            PSTORE_ASSERT (p.is_linear ());
                            auto * const linear = p.untag<linear_node *> ();
                            p = linear->flush (transaction) | internal_node_bit;
                            delete linear;
                        }
                    }
                }
                // Flush itself.
                return this->store_node (transaction) | internal_node_bit;
            }